

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_intersect(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  array_container_t *src_1;
  byte bVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  array_container_t *array2;
  array_container_t *paVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  uVar3 = (x1->high_low_container).size;
  uVar4 = (x2->high_low_container).size;
  uVar22 = 0;
  uVar23 = 0;
  do {
    bVar18 = (int)uVar22 < (int)uVar4 && (int)uVar23 < (int)uVar3;
    if ((int)uVar22 >= (int)uVar4 || (int)uVar23 >= (int)uVar3) {
      return bVar18;
    }
    puVar5 = (x1->high_low_container).keys;
    uVar20 = uVar23 & 0xffff;
    uVar1 = puVar5[uVar20];
    puVar6 = (x2->high_low_container).keys;
    uVar21 = uVar22 & 0xffff;
    uVar2 = puVar6[uVar21];
    if (uVar1 != uVar2) {
      if (uVar1 < uVar2) {
        uVar20 = uVar23 + 1;
        bVar10 = 1;
        uVar21 = uVar20;
        uVar13 = uVar22;
        if (((int)uVar20 < (int)uVar3) && (puVar5[(int)uVar20] < uVar2)) {
          uVar23 = uVar23 + 2;
          iVar16 = 0;
          uVar22 = uVar3 - 1;
          if ((int)uVar23 < (int)uVar3) {
            iVar15 = 1;
            do {
              uVar22 = uVar23;
              iVar16 = iVar15;
              if (uVar2 <= puVar5[(int)uVar23]) break;
              iVar16 = iVar15 * 2;
              uVar23 = uVar20 + iVar15 * 2;
              uVar22 = uVar3 - 1;
              iVar15 = iVar16;
            } while ((int)uVar23 < (int)uVar3);
            iVar16 = iVar16 >> 1;
          }
          uVar21 = uVar22;
          if (((puVar5[(int)uVar22] != uVar2) && (uVar21 = uVar3, uVar2 <= puVar5[(int)uVar22])) &&
             (uVar21 = uVar22, iVar16 + uVar20 + 1 != uVar22)) {
            uVar20 = iVar16 + uVar20;
            do {
              uVar21 = (int)(uVar20 + uVar22) >> 1;
              if (puVar5[(int)uVar21] == uVar2) break;
              uVar23 = uVar21;
              if (uVar2 <= puVar5[(int)uVar21]) {
                uVar23 = uVar20;
                uVar22 = uVar21;
              }
              uVar20 = uVar23;
              uVar21 = uVar22;
            } while (uVar20 + 1 != uVar22);
          }
        }
      }
      else {
        uVar20 = uVar22 + 1;
        bVar10 = 1;
        uVar21 = uVar23;
        uVar13 = uVar20;
        if (((int)uVar20 < (int)uVar4) && (puVar6[(int)uVar20] < uVar1)) {
          uVar22 = uVar22 + 2;
          iVar16 = 0;
          uVar23 = uVar4 - 1;
          if ((int)uVar22 < (int)uVar4) {
            iVar15 = 1;
            do {
              uVar23 = uVar22;
              iVar16 = iVar15;
              if (uVar1 <= puVar6[(int)uVar22]) break;
              iVar16 = iVar15 * 2;
              uVar22 = uVar20 + iVar15 * 2;
              uVar23 = uVar4 - 1;
              iVar15 = iVar16;
            } while ((int)uVar22 < (int)uVar4);
            iVar16 = iVar16 >> 1;
          }
          uVar13 = uVar23;
          if (((puVar6[(int)uVar23] != uVar1) && (uVar13 = uVar4, uVar1 <= puVar6[(int)uVar23])) &&
             (uVar13 = uVar23, iVar16 + uVar20 + 1 != uVar23)) {
            uVar20 = iVar16 + uVar20;
            do {
              uVar13 = (int)(uVar20 + uVar23) >> 1;
              if (puVar6[(int)uVar13] == uVar1) break;
              uVar22 = uVar13;
              if (uVar1 <= puVar6[(int)uVar13]) {
                uVar22 = uVar20;
                uVar23 = uVar13;
              }
              uVar20 = uVar22;
              uVar13 = uVar23;
            } while (uVar20 + 1 != uVar23);
          }
        }
      }
      goto LAB_0011d0df;
    }
    bVar10 = (x1->high_low_container).typecodes[uVar20];
    src_1 = (array_container_t *)(x1->high_low_container).containers[uVar20];
    bVar14 = (x2->high_low_container).typecodes[uVar21];
    array2 = (array_container_t *)(x2->high_low_container).containers[uVar21];
    if (bVar10 == 4) {
      bVar10 = *(byte *)&src_1->array;
      if (bVar10 == 4) goto LAB_0011d19e;
      src_1 = *(array_container_t **)src_1;
    }
    if (bVar14 == 4) {
      bVar14 = *(byte *)&array2->array;
      if (bVar14 == 4) {
LAB_0011d19e:
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      array2 = *(array_container_t **)array2;
    }
    switch((uint)bVar14 + (uint)bVar10 * 4) {
    case 5:
      bVar9 = true;
      if ((*(ulong *)src_1->array & *(ulong *)array2->array) == 0) {
        uVar17 = 0xffffffffffffffff;
        do {
          if (uVar17 == 0x3fe) {
            uVar11 = 0x3ff;
            break;
          }
          lVar7 = uVar17 + 2;
          uVar11 = uVar17 + 1;
          lVar8 = uVar17 + 2;
          uVar17 = uVar11;
        } while ((*(ulong *)((long)src_1->array + lVar8 * 8) &
                 *(ulong *)((long)array2->array + lVar7 * 8)) == 0);
        bVar9 = uVar11 < 0x3ff;
      }
      break;
    case 6:
      uVar17 = (ulong)array2->cardinality;
      bVar9 = 0 < (long)uVar17;
      if (0 < (long)uVar17) {
        uVar1 = *array2->array;
        bVar9 = true;
        if ((*(ulong *)(src_1->array + (ulong)(uVar1 >> 6) * 4) >> ((ulong)uVar1 & 0x3f) & 1) == 0)
        {
          uVar11 = 0;
          do {
            uVar12 = uVar17;
            if (uVar17 - 1 == uVar11) break;
            uVar1 = array2->array[uVar11 + 1];
            uVar11 = uVar11 + 1;
            uVar12 = uVar11;
          } while ((*(ulong *)(src_1->array + (ulong)(uVar1 >> 6) * 4) >> ((ulong)uVar1 & 0x3f) & 1)
                   == 0);
LAB_0011d174:
          bVar9 = uVar12 < uVar17;
        }
      }
      break;
    case 7:
      paVar19 = src_1;
      goto LAB_0011d0c1;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x139e,
                    "_Bool container_intersect(const container_t *, uint8_t, const container_t *, uint8_t)"
                   );
    case 9:
      uVar17 = (ulong)src_1->cardinality;
      bVar9 = 0 < (long)uVar17;
      if (0 < (long)uVar17) {
        uVar1 = *src_1->array;
        bVar9 = true;
        if ((*(ulong *)(array2->array + (ulong)(uVar1 >> 6) * 4) >> ((ulong)uVar1 & 0x3f) & 1) == 0)
        {
          uVar11 = 0;
          do {
            uVar12 = uVar17;
            if (uVar17 - 1 == uVar11) break;
            uVar1 = src_1->array[uVar11 + 1];
            uVar11 = uVar11 + 1;
            uVar12 = uVar11;
          } while ((*(ulong *)(array2->array + (ulong)(uVar1 >> 6) * 4) >> ((ulong)uVar1 & 0x3f) & 1
                   ) == 0);
          goto LAB_0011d174;
        }
      }
      break;
    case 10:
      bVar9 = array_container_intersect(src_1,array2);
      break;
    case 0xb:
      paVar19 = array2;
      goto LAB_0011d002;
    case 0xd:
      paVar19 = array2;
      array2 = src_1;
LAB_0011d0c1:
      bVar9 = run_bitset_container_intersect
                        ((run_container_t *)array2,(bitset_container_t *)paVar19);
      break;
    case 0xe:
      paVar19 = src_1;
      src_1 = array2;
LAB_0011d002:
      bVar9 = array_run_container_intersect(src_1,(run_container_t *)paVar19);
      break;
    case 0xf:
      bVar9 = run_container_intersect((run_container_t *)src_1,(run_container_t *)array2);
    }
    bVar10 = bVar9 ^ 1;
    uVar21 = uVar23 + bVar10;
    uVar13 = uVar22 + bVar10;
LAB_0011d0df:
    uVar22 = uVar13;
    uVar23 = uVar21;
    if (bVar10 == 0) {
      return bVar18;
    }
  } while( true );
}

Assistant:

bool roaring_bitmap_intersect(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(& x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(& x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            if (container_intersect(c1, type1, c2, type2))
                return true;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(& x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(& x2->high_low_container, s1, pos2);
        }
    }
    return answer != 0;
}